

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O0

void wallet::init_tests::walletinit_verify_walletdir_default_invoker(void)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  walletinit_verify_walletdir_default t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff148;
  std_string *in_stack_fffffffffffff150;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff158;
  const_string *in_stack_fffffffffffff170;
  size_t in_stack_fffffffffffff178;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff180;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff188;
  undefined1 local_cc0 [408];
  undefined1 local_b28 [408];
  undefined1 local_990 [408];
  undefined1 local_7f8 [1624];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,
             (pointer)in_stack_fffffffffffff150,(unsigned_long)in_stack_fffffffffffff148);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff148);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff148);
  boost::operator<<(in_stack_fffffffffffff158,(char *)in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [36])in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [15])in_stack_fffffffffffff150);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff158);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff188,in_stack_fffffffffffff180,in_stack_fffffffffffff178,
             in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff148);
  walletinit_verify_walletdir_default::walletinit_verify_walletdir_default
            ((walletinit_verify_walletdir_default *)in_stack_fffffffffffff148);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,
             (pointer)in_stack_fffffffffffff150,(unsigned_long)in_stack_fffffffffffff148);
  memset(local_7f8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff148);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff148);
  boost::operator<<(in_stack_fffffffffffff158,(char *)in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [36])in_stack_fffffffffffff150);
  pbVar1 = boost::operator<<(in_stack_fffffffffffff158,(char (*) [16])in_stack_fffffffffffff150);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff158);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff188,in_stack_fffffffffffff180,in_stack_fffffffffffff178,
             in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff148);
  boost::unit_test::setup_conditional<wallet::init_tests::walletinit_verify_walletdir_default>
            ((walletinit_verify_walletdir_default *)0xdb1eae);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,
             (pointer)in_stack_fffffffffffff150,(unsigned_long)in_stack_fffffffffffff148);
  memset(local_990,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff148);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff148);
  boost::operator<<(in_stack_fffffffffffff158,(char *)in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [36])in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [13])in_stack_fffffffffffff150);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff158);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff188,in_stack_fffffffffffff180,in_stack_fffffffffffff178,
             in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff148);
  walletinit_verify_walletdir_default::test_method((walletinit_verify_walletdir_default *)pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,
             (pointer)in_stack_fffffffffffff150,(unsigned_long)in_stack_fffffffffffff148);
  memset(local_b28,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff148);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff148);
  boost::operator<<(in_stack_fffffffffffff158,(char *)in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [36])in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [19])in_stack_fffffffffffff150);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff158);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff180,in_stack_fffffffffffff178,
             in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff148);
  boost::unit_test::teardown_conditional<wallet::init_tests::walletinit_verify_walletdir_default>
            ((walletinit_verify_walletdir_default *)0xdb20f8);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff158,
             (pointer)in_stack_fffffffffffff150,(unsigned_long)in_stack_fffffffffffff148);
  __s = local_cc0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff148);
  pbVar1 = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff148);
  boost::operator<<(in_stack_fffffffffffff158,(char *)in_stack_fffffffffffff150);
  boost::operator<<(in_stack_fffffffffffff158,(char (*) [36])in_stack_fffffffffffff150);
  this_00 = boost::operator<<(in_stack_fffffffffffff158,(char (*) [15])in_stack_fffffffffffff150);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)pbVar1);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff148);
  walletinit_verify_walletdir_default::~walletinit_verify_walletdir_default
            ((walletinit_verify_walletdir_default *)in_stack_fffffffffffff148);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_default)
{
    SetWalletDir(m_walletdir_path_cases["default"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}